

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O2

PageBitVector * __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::GetUnAllocatedPages
          (PageBitVector *__return_storage_ptr__,PageSegmentBase<Memory::VirtualAllocWrapper> *this)

{
  Type TVar1;
  Type TVar2;
  Type TVar3;
  
  __return_storage_ptr__->data[4].word = (this->freePages).data[4].word;
  TVar1 = (this->freePages).data[0].word;
  TVar2 = (this->freePages).data[1].word;
  TVar3 = (this->freePages).data[3].word;
  __return_storage_ptr__->data[2].word = (this->freePages).data[2].word;
  __return_storage_ptr__->data[3].word = TVar3;
  __return_storage_ptr__->data[0].word = TVar1;
  __return_storage_ptr__->data[1].word = TVar2;
  BVStatic<272UL>::Or(__return_storage_ptr__,&this->decommitPages);
  return __return_storage_ptr__;
}

Assistant:

PageBitVector GetUnAllocatedPages() const
    {
        PageBitVector unallocPages = freePages;
        unallocPages.Or(&decommitPages);
        return unallocPages;
    }